

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
vkt::shaderexecutor::
createApply<vkt::shaderexecutor::Signature<float,tcu::Vector<float,2>,int,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (shaderexecutor *this,
          Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *func,ExprP<tcu::Vector<float,_2>_> *arg0,ExprP<int> *arg1,
          ExprP<vkt::shaderexecutor::Void> *arg2,ExprP<vkt::shaderexecutor::Void> *arg3)

{
  Apply<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  ExprP<float> EVar1;
  
  this_00 = (Apply<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *)operator_new(0x50);
  Apply<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_int,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::Apply(this_00,func,arg0,arg1,arg2,arg3);
  EVar1 = exprP<float>(this,(Expr<float> *)this_00);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}